

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O1

void inimenu(void)

{
  long *plVar1;
  int iVar2;
  byte unaff_BPL;
  int *piVar3;
  long lVar4;
  char a;
  string s;
  stringstream ss;
  ifstream fin;
  byte local_409;
  char *local_408;
  long local_400;
  char local_3f8 [16];
  int *local_3e8;
  int *local_3e0;
  int *local_3d8;
  item *local_3d0;
  double local_3c8;
  long local_3c0 [2];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  char local_238 [520];
  
  std::ifstream::ifstream(local_238,"menu.txt",_S_in);
  local_408 = local_3f8;
  local_400 = 0;
  local_3f8[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  lVar4 = 0;
LAB_00102837:
  local_400 = 0;
  *local_408 = '\0';
  local_3e8 = &ITEM[lVar4].span;
  local_3d0 = ITEM + lVar4;
  local_3d8 = &ITEM[lVar4].manu;
  local_3e0 = &ITEM[lVar4].amount;
  iVar2 = 0;
  do {
    local_3c8 = (double)((char)unaff_BPL + -0x30);
LAB_0010288f:
    plVar1 = (long *)std::istream::get(local_238);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) goto LAB_001029bb;
    if ((9 < (byte)(local_409 - 0x30)) && (0x19 < (byte)((local_409 & 0xdf) + 0xbf))) break;
    std::__cxx11::string::push_back((char)&local_408);
    unaff_BPL = local_409;
  } while( true );
  if ((local_409 != 0x20) && (local_409 != 10)) goto LAB_0010288f;
  switch(iVar2) {
  case 0:
    std::__cxx11::string::_M_assign((string *)local_3d0);
    goto switchD_001028f1_default;
  case 1:
    *(double *)(local_3e8 + -4) = local_3c8;
    goto switchD_001028f1_default;
  case 2:
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_408,local_400);
    piVar3 = local_3e0;
    break;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_408,local_400);
    piVar3 = local_3d8;
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_408,local_400);
    piVar3 = local_3e8;
    break;
  default:
    goto switchD_001028f1_default;
  }
  std::istream::operator>>((istream *)local_3c0,piVar3);
switchD_001028f1_default:
  if (3 < iVar2) {
LAB_001029bb:
    lVar4 = lVar4 + 1;
    if (lVar4 == 5) {
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
      std::ios_base::~ios_base(local_340);
      if (local_408 != local_3f8) {
        operator_delete(local_408);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    goto LAB_00102837;
  }
  iVar2 = iVar2 + 1;
  local_400 = 0;
  *local_408 = '\0';
  std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
  goto LAB_0010288f;
}

Assistant:

void inimenu() {
    ifstream fin("menu.txt");
    char a, b;
    string s;
    stringstream ss;
    int i, j;

    for (i = 0; i < number; i++) {
        j = 0;
        s.erase(0);
        while (fin.get(a)) {
            if ((a >= 'a' && a <= 'z') || (a >= 'A' && a <= 'Z') || (a >= '0' && a <= '9')) {
                s += a;
                b = a;
            } else if (a == ' ' || a == '\n') {
                switch (j) {
                    case 0:
                        ITEM[i].name = s;
                        break;
                    case 1:
                        ITEM[i].price = b - '0';
                        break;
                    case 2:
                        ss << s;
                        ss >> ITEM[i].amount;
                        break;
                    case 3:
                        ss << s;
                        ss >> ITEM[i].manu;
                        break;
                    case 4:
                        ss << s;
                        ss >> ITEM[i].span;
                }
                j++;
                if (j > 4) {
                    break;
                }

                s.erase(0);
                ss.clear();
            }
        }
    }
    fin.close();
}